

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O3

void __thiscall cmCMakePresetsGraph::TestPreset::TestPreset(TestPreset *this,TestPreset *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  pointer pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__TestPreset_0084ce38;
  paVar1 = &(this->ConfigurePreset).field_2;
  (this->ConfigurePreset)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->ConfigurePreset)._M_dataplus._M_p;
  paVar5 = &(param_1->ConfigurePreset).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&(param_1->ConfigurePreset).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ConfigurePreset).field_2 + 8) = uVar3;
  }
  else {
    (this->ConfigurePreset)._M_dataplus._M_p = pcVar2;
    (this->ConfigurePreset).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->ConfigurePreset)._M_string_length = (param_1->ConfigurePreset)._M_string_length;
  (param_1->ConfigurePreset)._M_dataplus._M_p = (pointer)paVar5;
  (param_1->ConfigurePreset)._M_string_length = 0;
  (param_1->ConfigurePreset).field_2._M_local_buf[0] = '\0';
  (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  paVar1 = &(this->Configuration).field_2;
  (this->Configuration)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->Configuration)._M_dataplus._M_p;
  paVar5 = &(param_1->Configuration).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&(param_1->Configuration).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Configuration).field_2 + 8) = uVar3;
  }
  else {
    (this->Configuration)._M_dataplus._M_p = pcVar2;
    (this->Configuration).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->Configuration)._M_string_length = (param_1->Configuration)._M_string_length;
  (param_1->Configuration)._M_dataplus._M_p = (pointer)paVar5;
  (param_1->Configuration)._M_string_length = 0;
  (param_1->Configuration).field_2._M_local_buf[0] = '\0';
  pbVar4 = (param_1->OverwriteConfigurationFile).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->OverwriteConfigurationFile).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  (this->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->OverwriteConfigurationFile).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->OverwriteConfigurationFile).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Output).super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
  _M_payload.
  super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
  super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_engaged = false;
  if ((param_1->Output).
      super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_engaged ==
      true) {
    std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>::
    _M_construct<cmCMakePresetsGraph::TestPreset::OutputOptions>
              ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions> *)
               &this->Output,(OutputOptions *)&param_1->Output);
  }
  (this->Filter).super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>.
  _M_payload.
  super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>.
  super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>._M_engaged = false;
  if ((param_1->Filter).
      super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>.
      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>._M_engaged ==
      true) {
    std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>::
    _M_construct<cmCMakePresetsGraph::TestPreset::FilterOptions>
              ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions> *)
               &this->Filter,(FilterOptions *)&param_1->Filter);
  }
  std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::
  _Optional_payload_base
            ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions> *)
             &this->Execution,
             (param_1->Execution).
             super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
             _M_payload.
             super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
             .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>.
             _M_engaged,
             (_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions> *)
             &param_1->Execution);
  return;
}

Assistant:

TestPreset(TestPreset&& /*other*/) = default;